

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O3

string * __thiscall
cmPolicies::GetPolicyWarning_abi_cxx11_(string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  char *__s;
  char *__s_00;
  size_t sVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d8;
  size_t local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined8 local_98;
  size_t local_90;
  char *local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  size_t local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  __s = idToString((PolicyID)this);
  __s_00 = idToShortDescription((PolicyID)this);
  local_d8.first._M_len = 7;
  local_d8.first._M_str = "Policy ";
  local_d8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  sVar1 = strlen(__s);
  local_b0 = 0;
  local_a8 = 0xd;
  local_a0 = " is not set: ";
  local_98 = 0;
  local_c0 = sVar1;
  local_b8 = __s;
  local_90 = strlen(__s_00);
  local_80 = 0;
  local_78 = 0x1b;
  local_70 = "  Run \"cmake --help-policy ";
  local_68 = 0;
  local_50 = 0;
  local_48 = 0x60;
  local_40 = 
  "\" for policy details.  Use the cmake_policy command to set the policy and suppress this warning."
  ;
  local_38 = 0;
  views._M_len = 7;
  views._M_array = &local_d8;
  local_88 = __s_00;
  local_60 = sVar1;
  local_58 = __s;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmPolicies::GetPolicyWarning(cmPolicies::PolicyID id)
{
  return cmStrCat("Policy ", idToString(id),
                  " is not set: ", idToShortDescription(id),
                  "  "
                  "Run \"cmake --help-policy ",
                  idToString(id),
                  "\" for "
                  "policy details.  "
                  "Use the cmake_policy command to set the policy "
                  "and suppress this warning.");
}